

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseVector
          (Parser *this,Type *vector_type,uoffset_t *ovalue,FieldDef *field,size_t fieldn)

{
  Offset<flatbuffers::Table> *begin;
  StructDef **this_00;
  Offset<flatbuffers::Table> *end;
  anon_class_8_1_ba1d59bf comparator;
  FieldDef *end_00;
  anon_class_8_1_6663148b swapper;
  uoffset_t uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong len;
  const_iterator cVar6;
  uoffset64_t element;
  size_t *psVar7;
  long lVar8;
  Parser *this_01;
  StructDef *in_R9;
  size_t sVar9;
  anon_class_16_2_e19d79f7 comparator_00;
  undefined6 uStack_178;
  CheckedError ce;
  size_t align;
  StructDef *pSStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  pointer local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  voffset_t local_128;
  FieldDef *local_120;
  vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
  *local_110;
  Type local_108;
  undefined1 local_e8 [96];
  _Rb_tree_color local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  pointer local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  voffset_t local_48;
  Namespace *local_40;
  
  local_108.base_type = ovalue[1];
  local_108.fixed_length = (uint16_t)ovalue[6];
  local_108.element = BASE_TYPE_NONE;
  local_108.struct_def._0_2_ = (undefined2)*(undefined8 *)(ovalue + 2);
  local_108.struct_def._2_6_ = (undefined6)((ulong)*(undefined8 *)(ovalue + 2) >> 0x10);
  local_108.enum_def._0_2_ = (undefined2)*(undefined8 *)(ovalue + 4);
  local_108.enum_def._2_6_ = (undefined6)((ulong)*(undefined8 *)(ovalue + 4) >> 0x10);
  local_e8._80_8_ = field;
  local_e8._88_8_ = ovalue;
  Expect((Parser *)&ce,(int)vector_type);
  if (ce.is_error_ == false) {
    local_110 = (vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                 *)&vector_type[0x39].enum_def;
    sVar9 = 0;
    do {
      ce.has_been_checked_ = true;
      if (((byte)(sVar9 == 0 | *(byte *)((long)&vector_type[0x1f].struct_def + 2) ^ 1) == 1) &&
         (*(int *)&vector_type->field_0x1c == 0x5d)) {
LAB_001136d0:
        ce.has_been_checked_ = true;
        Next((Parser *)&ce);
        if (ce.is_error_ != true) {
          ce.is_error_ = false;
          *(undefined1 *)&(this->super_ParserState).prev_cursor_ = 0;
          ce.has_been_checked_ = true;
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          local_110 = (vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
                       *)InlineAlignment(&local_108);
          sVar4 = InlineSize(&local_108);
          sVar5 = InlineAlignment(&local_108);
          len = (sVar4 * sVar9) / sVar5;
          sVar4 = InlineAlignment(&local_108);
          local_158._M_allocated_capacity._0_7_ = 0x615f6563726f66;
          local_158._7_4_ = 0x6e67696c;
          pSStack_160 = (StructDef *)0xb;
          local_158._M_local_buf[0xb] = '\0';
          align = (size_t)&local_158;
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)(fieldn + 0x58),(key_type *)&align);
          if (cVar6._M_node == (_Base_ptr)(fieldn + 0x60)) {
            lVar8 = 0;
          }
          else {
            lVar8 = *(long *)(cVar6._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)align != &local_158) {
            operator_delete((void *)align,
                            CONCAT17(local_158._M_local_buf[7],local_158._M_allocated_capacity._0_7_
                                    ) + 1);
          }
          if (lVar8 != 0) {
            ParseAlignAttribute(this,(string *)vector_type,lVar8 + 0x20,(size_t *)0x1);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
            if (1 < align) {
              FlatBufferBuilderImpl<false>::ForceVectorAlignment
                        ((FlatBufferBuilderImpl<false> *)&vector_type[0xe].struct_def,len,sVar4,
                         align);
            }
          }
          this_00 = &vector_type[0xe].struct_def;
          this_01 = (Parser *)this_00;
          FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                    ((FlatBufferBuilderImpl<false> *)this_00,len,sVar4,(size_t)local_110);
          sVar4 = sVar9;
          if (sVar9 != 0) goto LAB_0011385e;
          goto LAB_00113c95;
        }
        break;
      }
      local_e8._32_8_ = local_e8 + 0x30;
      local_e8._48_2_ = 0x30;
      local_e8._40_8_ = 1;
      local_e8._64_2_ = 0xffff;
      local_e8._0_8_ = CONCAT44(local_108.element,local_108.base_type);
      local_e8._8_2_ = local_108.struct_def._0_2_;
      local_e8._10_2_ = (undefined2)local_108.struct_def._2_6_;
      local_e8._12_4_ = SUB64(local_108.struct_def._2_6_,2);
      local_e8._16_2_ = local_108.enum_def._0_2_;
      local_e8._18_2_ = (undefined2)local_108.enum_def._2_6_;
      local_e8._20_4_ = SUB64(local_108.enum_def._2_6_,2);
      local_e8._24_2_ = local_108.fixed_length;
      ParseAnyValue((Parser *)&ce,(Value *)vector_type,(FieldDef *)local_e8,fieldn,in_R9,0,
                    SUB81(sVar9,0));
      ce.has_been_checked_ = true;
      if (ce.is_error_ == false) {
        uStack_80._2_2_ = local_e8._10_2_;
        uStack_80._0_2_ = local_e8._8_2_;
        local_78._2_2_ = local_e8._18_2_;
        local_78._0_2_ = local_e8._16_2_;
        uStack_70 = CONCAT22(local_e8._26_2_,local_e8._24_2_);
        uStack_74 = local_e8._20_4_;
        uStack_6c = local_e8._28_4_;
        local_88 = local_e8._0_4_;
        uStack_84 = local_e8._4_4_;
        uStack_7c = local_e8._12_4_;
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_e8._32_8_,(pointer)(local_e8._32_8_ + local_e8._40_8_))
        ;
        local_48 = local_e8._64_2_;
        local_40 = (Namespace *)0x0;
        align = CONCAT44(uStack_84,local_88);
        pSStack_160 = (StructDef *)CONCAT44(uStack_7c,uStack_80);
        local_158._M_allocated_capacity._0_7_ = (undefined7)CONCAT44(uStack_74,local_78);
        local_158._8_3_ = (undefined3)uStack_70;
        local_158._M_local_buf[7] = SUB41(uStack_74,3);
        local_158._M_local_buf[0xb] = (char)((uint)uStack_70 >> 0x18);
        local_158._12_4_ = uStack_6c;
        if (local_68 == &local_58) {
          local_138._8_8_ = local_58._8_8_;
          local_148._M_p = (pointer)&local_138;
        }
        else {
          local_148._M_p = (pointer)local_68;
        }
        local_138._M_allocated_capacity._1_7_ = local_58._M_allocated_capacity._1_7_;
        local_138._M_local_buf[0] = local_58._M_local_buf[0];
        local_140 = local_60;
        local_60 = (pointer)0x0;
        local_58._M_local_buf[0] = '\0';
        local_128 = local_e8._64_2_;
        local_120 = (FieldDef *)0x0;
        local_68 = &local_58;
        std::
        vector<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>,std::allocator<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>>
        ::emplace_back<std::pair<flatbuffers::Value,flatbuffers::FieldDef*>>
                  (local_110,(pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)&align);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_p != &local_138) {
          operator_delete(local_148._M_p,local_138._0_8_ + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT71(local_58._M_allocated_capacity._1_7_,
                                            local_58._M_local_buf[0]) + 1);
        }
        ce.is_error_ = false;
        ce.has_been_checked_ = false;
      }
      if ((undefined1 *)local_e8._32_8_ != local_e8 + 0x30) {
        operator_delete((void *)local_e8._32_8_,CONCAT62(local_e8._50_6_,local_e8._48_2_) + 1);
      }
      ce.has_been_checked_ = true;
      if ((ce.is_error_ & 1U) != 0) break;
      if (*(int *)&vector_type->field_0x1c == 0x5d) {
        sVar9 = sVar9 + 1;
        goto LAB_001136d0;
      }
      if ((*(char *)&vector_type[0x2a].struct_def != '\0') ||
         (Expect((Parser *)&ce,(int)vector_type), ce.is_error_ == false)) {
        ce.is_error_ = false;
      }
      sVar9 = sVar9 + 1;
    } while (ce.is_error_ == false);
  }
  *(bool *)&(this->super_ParserState).prev_cursor_ = ce.is_error_;
  ce.has_been_checked_ = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  goto LAB_001136fa;
  while( true ) {
    lVar8 = *(long *)&vector_type[0x39].fixed_length;
    *(long *)&vector_type[0x39].fixed_length = lVar8 + -0x50;
    this_01 = *(Parser **)(lVar8 + -0x30);
    if (this_01 != (Parser *)(lVar8 + -0x20)) {
      operator_delete(this_01,(ulong)((((Parser *)(lVar8 + -0x20))->super_ParserState).prev_cursor_
                                     + 1));
    }
    sVar4 = sVar4 - 1;
    if (sVar4 == 0) break;
LAB_0011385e:
    lVar8 = *(long *)&vector_type[0x39].fixed_length;
    switch(*(undefined4 *)(lVar8 + -0x50)) {
    case 0:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (uchar *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uchar)align);
      break;
    case 1:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (uchar *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uchar)align);
      break;
    case 2:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (uchar *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uchar)align);
      break;
    case 3:
      anon_unknown_0::atot<signed_char>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (char *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uchar)align);
      break;
    case 4:
      anon_unknown_0::atot<unsigned_char>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (uchar *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uchar)align);
      break;
    case 5:
      anon_unknown_0::atot<short>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (short *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(unsigned_short)align);
      break;
    case 6:
      anon_unknown_0::atot<unsigned_short>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (unsigned_short *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(unsigned_short)align);
      break;
    case 7:
      anon_unknown_0::atot<int>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (int *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(int)(float)align);
      break;
    case 8:
      anon_unknown_0::atot<unsigned_int>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (uint *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(uint)(float)align);
      break;
    case 9:
      anon_unknown_0::atot<long>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (long *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,align);
      break;
    case 10:
      anon_unknown_0::atot<unsigned_long>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,align);
      break;
    case 0xb:
      anon_unknown_0::atot<float>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (float *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(float)align);
      break;
    case 0xc:
      anon_unknown_0::atot<double>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (double *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(double)align);
      break;
    case 0xd:
      uVar1 = atoi(*(char **)(lVar8 + -0x30));
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
      uVar1 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      break;
    case 0xe:
      uVar1 = atoi(*(char **)(lVar8 + -0x30));
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
      uVar1 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      break;
    case 0xf:
      if ((*(StructDef **)(lVar8 + -0x48))->fixed == true) {
        SerializeStruct(this_01,(FlatBufferBuilder *)this_00,*(StructDef **)(lVar8 + -0x48),
                        (Value *)(lVar8 + -0x50));
      }
      else {
        uVar1 = atoi(*(char **)(lVar8 + -0x30));
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
        uVar1 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)this_00,uVar1)
        ;
        FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                  ((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      }
      break;
    case 0x10:
      uVar1 = atoi(*(char **)(lVar8 + -0x30));
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
      uVar1 = FlatBufferBuilderImpl<false>::ReferTo((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,uVar1);
      break;
    case 0x11:
      anon_unknown_0::atot<int>
                ((anon_unknown_0 *)this,*(char **)(lVar8 + -0x30),(Parser *)vector_type,
                 (int *)&align);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001136fa;
      FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,(int)(float)align);
      break;
    case 0x12:
      iVar2 = atoi(*(char **)(lVar8 + -0x30));
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
      element = FlatBufferBuilderImpl<false>::ReferTo
                          ((FlatBufferBuilderImpl<false> *)this_00,(long)iVar2);
      FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                ((FlatBufferBuilderImpl<false> *)this_00,element);
    }
  }
LAB_00113c95:
  vector_type[0x10].enum_def =
       (EnumDef *)
       ((long)vector_type[0x10].enum_def + (ulong)*(uint *)&vector_type[0x10].fixed_length * -8);
  *(undefined4 *)&vector_type[0x10].fixed_length = 0;
  *(undefined2 *)&vector_type[0x10].field_0x1c = 0;
  if (*(uoffset_t *)local_e8._88_8_ == 0x12) {
    uVar3 = FlatBufferBuilderImpl<false>::EndVector<unsigned_long,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)this_00,sVar9);
  }
  else {
    uVar3 = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                      ((FlatBufferBuilderImpl<false> *)this_00,sVar9);
  }
  *(uint *)&(((Definition *)local_e8._80_8_)->name)._M_dataplus._M_p = uVar3;
  if ((local_108.base_type == BASE_TYPE_STRUCT) &&
     (lVar8 = CONCAT62(local_108.struct_def._2_6_,local_108.struct_def._0_2_),
     *(char *)(lVar8 + 0x113) == '\x01')) {
    psVar7 = *(size_t **)(lVar8 + 0xf8);
    while( true ) {
      if (psVar7 == *(size_t **)(lVar8 + 0x100)) {
        __assert_fail("key",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x6ea,
                      "CheckedError flatbuffers::Parser::ParseVector(const Type &, uoffset_t *, FieldDef *, size_t)"
                     );
      }
      sVar9 = *psVar7;
      if (*(char *)(sVar9 + 0x111) != '\0') break;
      psVar7 = psVar7 + 1;
    }
    comparator.key = (FieldDef *)vector_type[0x10].struct_def;
    if (*(char *)(lVar8 + 0x110) == '\x01') {
      if (comparator.key == (FieldDef *)0x0) {
LAB_00113dd3:
        __assert_fail("cur_",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                      ,0xb3,
                      "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]"
                     );
      }
      end_00 = *(FieldDef **)(lVar8 + 0x120);
      swapper.struct_size._6_1_ = ce.is_error_;
      swapper.struct_size._0_6_ = uStack_178;
      swapper.struct_size._7_1_ = ce.has_been_checked_;
      comparator_00.key = end_00;
      comparator_00._0_8_ = sVar9;
      (anonymous_namespace)::
      SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
                ((_anonymous_namespace_ *)
                 ((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p + 4),
                 (uchar *)((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p +
                          (ulong)*(uint *)&((comparator.key)->super_Definition).name._M_dataplus.
                                           _M_p * (long)end_00 + 4),(uchar *)end_00,
                 (ulong)*(uint *)(sVar9 + 0x108),comparator_00,swapper);
    }
    else {
      if (comparator.key == (FieldDef *)0x0) goto LAB_00113dd3;
      begin = (Offset<flatbuffers::Table> *)
              ((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p + 4);
      end = (Offset<flatbuffers::Table> *)
            ((long)&((comparator.key)->super_Definition).name._M_dataplus._M_p +
            (ulong)*(uint *)&((comparator.key)->super_Definition).name._M_dataplus._M_p * 4 + 4);
      if (*(int *)(sVar9 + 200) == 0xd) {
        (anonymous_namespace)::
        SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                  (begin,end,sVar9,comparator,
                   (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)sVar9
                  );
      }
      else {
        (anonymous_namespace)::
        SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__4,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
                  (begin,end,sVar9,comparator,
                   (_func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *)sVar9
                  );
      }
    }
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_001136fa:
  if (ce.has_been_checked_ == false) {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseVector(const Type &vector_type, uoffset_t *ovalue,
                                 FieldDef *field, size_t fieldn) {
  Type type = vector_type.VectorType();
  size_t count = 0;
  auto err = ParseVectorDelimiters(count, [&](size_t &) -> CheckedError {
    Value val;
    val.type = type;
    ECHECK(ParseAnyValue(val, field, fieldn, nullptr, count, true));
    field_stack_.push_back(std::make_pair(val, nullptr));
    return NoError();
  });
  ECHECK(err);

  const size_t alignment = InlineAlignment(type);
  const size_t len = count * InlineSize(type) / InlineAlignment(type);
  const size_t elemsize = InlineAlignment(type);
  const auto force_align = field->attributes.Lookup("force_align");
  if (force_align) {
    size_t align;
    ECHECK(ParseAlignAttribute(force_align->constant, 1, &align));
    if (align > 1) { builder_.ForceVectorAlignment(len, elemsize, align); }
  }

  // TODO Fix using element alignment as size (`elemsize`)!
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    // TODO(derekbailey): this requires a 64-bit builder.
    // builder_.StartVector<Offset64, uoffset64_t>(len, elemsize, alignment);
    builder_.StartVector(len, elemsize, alignment);
  } else {
    builder_.StartVector(len, elemsize, alignment);
  }
  for (size_t i = 0; i < count; i++) {
    // start at the back, since we're building the data backwards.
    auto &val = field_stack_.back().first;
    switch (val.type.base_type) {
      // clang-format off
      #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE,...) \
        case BASE_TYPE_ ## ENUM: \
          if (IsStruct(val.type)) SerializeStruct(*val.type.struct_def, val); \
          else { \
             CTYPE elem; \
             ECHECK(atot(val.constant.c_str(), *this, &elem)); \
             builder_.PushElement(elem); \
          } \
          break;
        FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
      #undef FLATBUFFERS_TD
      // clang-format on
    }
    field_stack_.pop_back();
  }

  builder_.ClearOffsets();
  if (vector_type.base_type == BASE_TYPE_VECTOR64) {
    *ovalue = builder_.EndVector<uoffset64_t>(count);
  } else {
    *ovalue = builder_.EndVector(count);
  }

  if (type.base_type == BASE_TYPE_STRUCT && type.struct_def->has_key) {
    // We should sort this vector. Find the key first.
    const FieldDef *key = nullptr;
    for (auto it = type.struct_def->fields.vec.begin();
         it != type.struct_def->fields.vec.end(); ++it) {
      if ((*it)->key) {
        key = (*it);
        break;
      }
    }
    FLATBUFFERS_ASSERT(key);
    // Now sort it.
    // We can't use std::sort because for structs the size is not known at
    // compile time, and for tables our iterators dereference offsets, so can't
    // be used to swap elements.
    // And we can't use C qsort either, since that would force use to use
    // globals, making parsing thread-unsafe.
    // So for now, we use SimpleQsort above.
    // TODO: replace with something better, preferably not recursive.

    if (type.struct_def->fixed) {
      const voffset_t offset = key->value.offset;
      const size_t struct_size = type.struct_def->bytesize;
      auto v =
          reinterpret_cast<VectorOfAny *>(builder_.GetCurrentBufferPointer());
      SimpleQsort<uint8_t>(
          v->Data(), v->Data() + v->size() * type.struct_def->bytesize,
          type.struct_def->bytesize,
          [offset, key](const uint8_t *a, const uint8_t *b) -> bool {
            return CompareSerializedScalars(a + offset, b + offset, *key);
          },
          [struct_size](uint8_t *a, uint8_t *b) {
            // FIXME: faster?
            for (size_t i = 0; i < struct_size; i++) { std::swap(a[i], b[i]); }
          });
    } else {
      auto v = reinterpret_cast<Vector<Offset<Table>> *>(
          builder_.GetCurrentBufferPointer());
      // Here also can't use std::sort. We do have an iterator type for it,
      // but it is non-standard as it will dereference the offsets, and thus
      // can't be used to swap elements.
      if (key->value.type.base_type == BASE_TYPE_STRING) {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByStringKey(_a, _b, *key);
            },
            SwapSerializedTables);
      } else {
        SimpleQsort<Offset<Table>>(
            v->data(), v->data() + v->size(), 1,
            [key](const Offset<Table> *_a, const Offset<Table> *_b) -> bool {
              return CompareTablesByScalarKey(_a, _b, *key);
            },
            SwapSerializedTables);
      }
    }
  }
  return NoError();
}